

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::isTrivialLeaf
          (TGlslangToSpvTraverser *this,TIntermTyped *node)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  TIntermTyped *node_local;
  TGlslangToSpvTraverser *this_local;
  
  if (node == (TIntermTyped *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])();
      if (CONCAT44(extraout_var_00,iVar1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x58))();
        uVar2 = *(uint *)(lVar3 + 8) & 0x7f;
        if ((((uVar2 < 3) || (uVar2 == 5)) || (uVar2 == 0x10)) || (uVar2 == 0x12 || uVar2 == 0x13))
        {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TGlslangToSpvTraverser::isTrivialLeaf(const glslang::TIntermTyped* node)
{
    // don't know what this is
    if (node == nullptr)
        return false;

    // a constant is safe
    if (node->getAsConstantUnion() != nullptr)
        return true;

    // not a symbol means non-trivial
    if (node->getAsSymbolNode() == nullptr)
        return false;

    // a symbol, depends on what's being read
    switch (node->getType().getQualifier().storage) {
    case glslang::EvqTemporary:
    case glslang::EvqGlobal:
    case glslang::EvqIn:
    case glslang::EvqInOut:
    case glslang::EvqConst:
    case glslang::EvqConstReadOnly:
    case glslang::EvqUniform:
        return true;
    default:
        return false;
    }
}